

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
CommandLineOptions::CommandLineOptions(CommandLineOptions *this,CommandLineOptions *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined3 uVar16;
  bool bVar17;
  undefined3 uVar18;
  SampleMode SVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  this->blankEOF = param_1->blankEOF;
  std::__cxx11::string::string((string *)&this->comment,(string *)&param_1->comment);
  std::__cxx11::string::string((string *)&this->delimiter,(string *)&param_1->delimiter);
  std::__cxx11::string::string((string *)&this->fileInput,(string *)&param_1->fileInput);
  std::__cxx11::string::string((string *)&this->fileOutput,(string *)&param_1->fileOutput);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->filterColumns,&param_1->filterColumns);
  DataFilters::DataFilters(&this->filterRows,&param_1->filterRows);
  uVar20 = param_1->headerRow;
  uVar21 = param_1->numLinesToKeep;
  uVar22 = param_1->numLinesToReshape;
  uVar23 = param_1->numLinesToSkip;
  bVar17 = param_1->removeDuplicates;
  uVar18 = *(undefined3 *)&param_1->field_0xf1;
  SVar19 = (param_1->sampling).mode;
  uVar1 = *(undefined8 *)&(param_1->sampling).step;
  bVar3 = param_1->showCorrelation;
  bVar4 = param_1->showCovariance;
  bVar5 = param_1->showHistogram;
  bVar6 = param_1->showFilteredData;
  bVar7 = param_1->showLeastSquaresOffset;
  bVar8 = param_1->showLeastSquaresSlope;
  bVar9 = param_1->showStatistics;
  uVar10 = param_1->field_0x107;
  bVar11 = (param_1->statisticsOptions).doCov;
  bVar12 = (param_1->statisticsOptions).doMax;
  bVar13 = (param_1->statisticsOptions).doMean;
  bVar14 = (param_1->statisticsOptions).doMin;
  bVar15 = (param_1->statisticsOptions).doVar;
  uVar16 = *(undefined3 *)&(param_1->statisticsOptions).field_0x5;
  uVar2 = *(undefined8 *)((long)&(param_1->statisticsOptions).histogramOptions.cacheSize + 2);
  *(undefined8 *)&(this->statisticsOptions).field_0x6 =
       *(undefined8 *)&(param_1->statisticsOptions).field_0x6;
  *(undefined8 *)((long)&(this->statisticsOptions).histogramOptions.cacheSize + 2) = uVar2;
  this->showCorrelation = bVar3;
  this->showCovariance = bVar4;
  this->showHistogram = bVar5;
  this->showFilteredData = bVar6;
  this->showLeastSquaresOffset = bVar7;
  this->showLeastSquaresSlope = bVar8;
  this->showStatistics = bVar9;
  this->field_0x107 = uVar10;
  (this->statisticsOptions).doCov = bVar11;
  (this->statisticsOptions).doMax = bVar12;
  (this->statisticsOptions).doMean = bVar13;
  (this->statisticsOptions).doMin = bVar14;
  (this->statisticsOptions).doVar = bVar15;
  *(undefined3 *)&(this->statisticsOptions).field_0x5 = uVar16;
  this->removeDuplicates = bVar17;
  *(undefined3 *)&this->field_0xf1 = uVar18;
  (this->sampling).mode = SVar19;
  *(undefined8 *)&(this->sampling).step = uVar1;
  this->headerRow = uVar20;
  this->numLinesToKeep = uVar21;
  this->numLinesToReshape = uVar22;
  this->numLinesToSkip = uVar23;
  return;
}

Assistant:

CommandLineOptions()
    {
        this->blankEOF = false;
        this->comment = "";
        this->delimiter = "";
        this->fileInput = "";
        this->fileOutput = "";
        this->filterColumns = std::vector<bool>();
        this->headerRow = 0;
        this->numLinesToKeep = std::numeric_limits<int>::max();
        this->numLinesToReshape = 1;
        this->numLinesToSkip = 0;
        this->removeDuplicates = false;
        this->seed = 1;
        this->showCorrelation = false;
        this->showCovariance = false;
        this->showFilteredData = false;
        this->showHistogram = false;
        this->showLeastSquaresOffset = false;
        this->showLeastSquaresSlope = false;
        this->showStatistics = false;
        this->strictParsing = false;
        this->verboseLevel = 0;
    }